

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

predictor * __thiscall Search::predictor::reset(predictor *this)

{
  erase_oracles(this);
  erase_alloweds(this);
  v_array<unsigned_int>::clear(&this->condition_on_tags);
  v_array<char>::clear(&this->condition_on_names);
  free_ec(this);
  return this;
}

Assistant:

predictor& predictor::reset()
{
  this->erase_oracles();
  this->erase_alloweds();
  condition_on_tags.clear();
  condition_on_names.clear();
  free_ec();
  return *this;
}